

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O0

int dumbfile_close(DUMBFILE *f)

{
  long lVar1;
  long *in_RDI;
  int rv;
  
  lVar1 = in_RDI[2];
  if (*(long *)(*in_RDI + 0x20) != 0) {
    (**(code **)(*in_RDI + 0x20))(in_RDI[1]);
  }
  free(in_RDI);
  return (uint)(lVar1 < 0);
}

Assistant:

int DUMBEXPORT dumbfile_close(DUMBFILE *f)
{
	int rv;

	ASSERT(f);

	rv = f->pos < 0;

	if (f->dfs->close)
		(*f->dfs->close)(f->file);

	free(f);

	return rv;
}